

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBlit.h
# Opt level: O1

void irr::executeBlit_TextureCombineColor_16_to_24(SBlitJob *job)

{
  float fVar1;
  float fVar2;
  ushort uVar3;
  uint uVar4;
  int iVar5;
  void *pvVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  void *pvVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  ushort *puVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  ushort *puVar20;
  
  uVar7 = (ulong)job->width;
  uVar4 = job->height;
  pvVar10 = job->dst;
  uVar12 = job->argb;
  uVar13 = uVar12 >> 0x10 & 0x8000;
  uVar14 = uVar12 >> 9 & 0x7c00;
  uVar15 = uVar12 >> 6 & 0x3e0;
  uVar12 = uVar12 >> 3 & 0x1f;
  if (job->stretch == false) {
    if (uVar4 != 0) {
      puVar16 = (ushort *)job->src;
      uVar11 = 0;
      do {
        if (uVar7 != 0) {
          uVar17 = 0;
          puVar20 = puVar16;
          do {
            uVar3 = *puVar20;
            if ((short)uVar3 < 0) {
              uVar19 = (uint)uVar3;
              uVar19 = (uVar19 & 0xffffffe0) * 0x40 + (uVar19 & 0x380) * 2 + (uVar19 & 0x1f) * 8;
              uVar8 = (uVar19 & 0x3e0) * uVar15 >> 10 & 0xffffffe0 |
                      uVar19 & 0xffff & uVar13 | (uVar3 >> 2 & 7 | uVar19 & 0x1f) * uVar12 >> 5;
              uVar9 = uVar17 & 0xffffffff;
              *(undefined1 *)((long)pvVar10 + uVar9) = 0;
              *(byte *)((long)pvVar10 + uVar9 + 1) =
                   (byte)(((uVar19 & 0x7c00) * uVar14 >> 0xf) >> 8) & 0x7c | (byte)(uVar8 >> 8);
              *(char *)((long)pvVar10 + uVar9 + 2) = (char)uVar8;
            }
            uVar17 = uVar17 + 3;
            puVar20 = puVar20 + 1;
          } while (uVar7 * 3 != uVar17);
        }
        puVar16 = (ushort *)((long)puVar16 + (long)job->srcPitch);
        pvVar10 = (void *)((long)pvVar10 + (ulong)job->dstPitch);
        uVar11 = uVar11 + 1;
      } while (uVar11 != uVar4);
    }
  }
  else if (uVar4 != 0) {
    fVar1 = (float)job->x_stretch;
    fVar2 = (float)job->y_stretch;
    uVar11 = 0;
    do {
      if (uVar7 != 0) {
        iVar5 = job->srcPitch;
        pvVar6 = job->src;
        uVar19 = 0;
        uVar17 = 0;
        do {
          uVar3 = *(ushort *)
                   ((long)pvVar6 +
                   ((long)((float)uVar19 * fVar1) & 0xffffffffU) * 2 +
                   (ulong)(uint)((int)(long)((float)uVar11 * fVar2) * iVar5));
          if ((short)uVar3 < 0) {
            uVar8 = (uint)uVar3;
            uVar8 = (uVar8 & 0xffffffe0) * 0x40 + (uVar8 & 0x380) * 2 + (uVar8 & 0x1f) * 8;
            uVar18 = (uVar8 & 0x3e0) * uVar15 >> 10 & 0xffffffe0 |
                     uVar8 & 0xffff & uVar13 | (uVar3 >> 2 & 7 | uVar8 & 0x1f) * uVar12 >> 5;
            uVar9 = uVar17 & 0xffffffff;
            *(undefined1 *)((long)pvVar10 + uVar9) = 0;
            *(byte *)((long)pvVar10 + uVar9 + 1) =
                 (byte)(((uVar8 & 0x7c00) * uVar14 >> 0xf) >> 8) & 0x7c | (byte)(uVar18 >> 8);
            *(char *)((long)pvVar10 + uVar9 + 2) = (char)uVar18;
          }
          uVar17 = uVar17 + 3;
          uVar19 = uVar19 + 1;
        } while (uVar7 * 3 != uVar17);
      }
      pvVar10 = (void *)((long)pvVar10 + (ulong)job->dstPitch);
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar4);
  }
  return;
}

Assistant:

static void executeBlit_TextureCombineColor_16_to_24(const SBlitJob *job)
{
	const u32 w = job->width;
	const u32 h = job->height;
	const u16 *src = static_cast<const u16 *>(job->src);
	u8 *dst = static_cast<u8 *>(job->dst);

	const u16 jobColor = video::A8R8G8B8toA1R5G5B5(job->argb);

	if (job->stretch) {
		const float wscale = job->x_stretch;
		const float hscale = job->y_stretch;

		for (u32 dy = 0; dy < h; ++dy) {
			const u32 src_y = (u32)(dy * hscale);
			src = (u16 *)((u8 *)(job->src) + job->srcPitch * src_y);

			for (u32 dx = 0; dx < w; ++dx) {
				const u32 src_x = (u32)(dx * wscale);
				u32 color = PixelMul16_2(video::A1R5G5B5toA8R8G8B8(src[src_x]), jobColor);
				u8 *writeTo = &dst[dx * 3];
				if (video::getAlpha(src[src_x]) > 0) { // only overlay if source has visible alpha (alpha == 1)
					*writeTo++ = (color >> 16) & 0xFF;
					*writeTo++ = (color >> 8) & 0xFF;
					*writeTo++ = color & 0xFF;
				}
			}
			dst += job->dstPitch;
		}
	} else {
		for (u32 dy = 0; dy != h; ++dy) {
			for (u32 dx = 0; dx != w; ++dx) {
				u32 color = PixelMul16_2(video::A1R5G5B5toA8R8G8B8(src[dx]), jobColor);
				u8 *writeTo = &dst[dx * 3];
				if (video::getAlpha(src[dx]) > 0) { // only overlay if source has visible alpha (alpha == 1)
					*writeTo++ = (color >> 16) & 0xFF;
					*writeTo++ = (color >> 8) & 0xFF;
					*writeTo++ = color & 0xFF;
				}
			}

			src = (u16 *)((u8 *)(src) + job->srcPitch);
			dst += job->dstPitch;
		}
	}
}